

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_fillreadbuffer(Curl_easy *data,size_t bytes,size_t *nreadp)

{
  dynbuf *pdVar1;
  char **ppcVar2;
  int *piVar3;
  undefined1 *puVar4;
  char *pcVar5;
  int iVar6;
  CURLcode CVar7;
  size_t sVar8;
  size_t sVar9;
  code *pcVar10;
  char *pcVar11;
  Curl_easy *pCVar12;
  ulong uVar13;
  size_t __n;
  Curl_easy *data_1;
  bool bVar14;
  curl_slist *trailers;
  undefined1 local_48 [7];
  uint uStack_41;
  char *local_38;
  
  if ((data->state).trailers_state == TRAILERS_INITIALIZED) {
    local_48 = (undefined1  [7])0x0;
    uStack_41 = uStack_41 & 0xffffff00;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Moving trailers state machine from initialized to sending.");
    }
    (data->state).trailers_state = TRAILERS_SENDING;
    pdVar1 = &(data->state).trailers_buf;
    Curl_dyn_init(pdVar1,0x10000);
    (data->state).trailers_bytes_sent = 0;
    Curl_set_in_callback(data,true);
    iVar6 = (*(data->set).trailer_callback)((curl_slist **)local_48,(data->set).trailer_data);
    Curl_set_in_callback(data,false);
    if (iVar6 == 0) {
      CVar7 = Curl_http_compile_trailers
                        ((curl_slist *)CONCAT17((undefined1)uStack_41,local_48),pdVar1,data);
    }
    else {
      Curl_failf(data,"operation aborted by trailing headers callback");
      *nreadp = 0;
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
    }
    if (CVar7 == CURLE_OK) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"Successfully compiled trailers.");
      }
    }
    else {
      Curl_dyn_free(pdVar1);
    }
    curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_41,local_48));
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
  }
  if ((((data->req).field_0xbc & 2) != 0) && ((data->state).trailers_state == TRAILERS_NONE)) {
    bytes = bytes - 0xc;
    ppcVar2 = &(data->req).upload_fromhere;
    *ppcVar2 = *ppcVar2 + 10;
  }
  bVar14 = (data->state).trailers_state != TRAILERS_SENDING;
  if (bVar14) {
    pcVar10 = (data->state).fread_func;
    pCVar12 = (Curl_easy *)(data->state).in;
  }
  else {
    pcVar10 = trailers_read;
    pCVar12 = data;
  }
  bVar14 = !bVar14;
  if ((data->req).fread_eof[bVar14] == '\0') {
    Curl_set_in_callback(data,true);
    uVar13 = (*pcVar10)((data->req).upload_fromhere,1,bytes,pCVar12);
    Curl_set_in_callback(data,false);
    (data->req).fread_eof[bVar14] = uVar13 == 0;
  }
  else {
    uVar13 = 0;
  }
  if (uVar13 == 0x10000001) {
    if ((data->conn->handler->flags & 0x10) == 0) {
      piVar3 = &(data->req).keepon;
      *(byte *)piVar3 = (byte)*piVar3 | 0x20;
      if (((data->req).field_0xbc & 2) != 0) {
        ppcVar2 = &(data->req).upload_fromhere;
        *ppcVar2 = *ppcVar2 + -10;
      }
      *nreadp = 0;
      return CURLE_OK;
    }
    pcVar11 = "Read callback asked for PAUSE when not supported";
LAB_0068843a:
    Curl_failf(data,pcVar11);
    return CURLE_READ_ERROR;
  }
  if (uVar13 == 0x10000000) {
    Curl_failf(data,"operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if (bytes < uVar13) {
    *nreadp = 0;
    pcVar11 = "read function returned funny value";
    goto LAB_0068843a;
  }
  if ((*(ushort *)&(data->req).field_0xbb & 0xa00) != 0x200) goto LAB_006885dc;
  if (((data->state).field_0x74d & 0x40) == 0) {
    local_38 = "\n";
    if (((data->set).field_0x8ba & 0x10) == 0) {
      local_38 = "\r\n";
    }
  }
  else {
    local_38 = "\n";
  }
  if ((data->state).trailers_state == TRAILERS_SENDING) {
    bVar14 = false;
    __n = 0;
  }
  else {
    local_48 = (undefined1  [7])0x0;
    uStack_41 = 0;
    iVar6 = curl_msnprintf(local_48,0xb,"%zx%s",uVar13);
    __n = (size_t)iVar6;
    pcVar11 = (data->req).upload_fromhere + -__n;
    (data->req).upload_fromhere = pcVar11;
    sVar8 = uVar13 + __n;
    memcpy(pcVar11,local_48,__n);
    pcVar11 = local_38;
    if (((uVar13 == 0) && ((data->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data->state).trailers_state == TRAILERS_NONE)) {
      (data->state).trailers_state = TRAILERS_INITIALIZED;
      bVar14 = false;
      uVar13 = sVar8;
    }
    else {
      pcVar5 = (data->req).upload_fromhere;
      sVar9 = strlen(local_38);
      memcpy(pcVar5 + sVar8,pcVar11,sVar9);
      bVar14 = true;
      uVar13 = sVar8;
    }
  }
  if ((data->state).trailers_state == TRAILERS_SENDING) {
    pdVar1 = &(data->state).trailers_buf;
    sVar8 = Curl_dyn_len(pdVar1);
    if (sVar8 != (data->state).trailers_bytes_sent) goto LAB_0068858b;
    Curl_dyn_free(pdVar1);
    (data->state).trailers_state = TRAILERS_DONE;
    (data->set).trailer_data = (void *)0x0;
    (data->set).trailer_callback = (curl_trailer_callback)0x0;
    puVar4 = &(data->req).field_0xbb;
    *puVar4 = *puVar4 | 0x10;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      pcVar11 = "Signaling end of chunked upload after trailers.";
      goto LAB_006885b8;
    }
  }
  else {
LAB_0068858b:
    if (((uVar13 == __n) && ((data->state).trailers_state != TRAILERS_INITIALIZED)) &&
       ((puVar4 = &(data->req).field_0xbb, *puVar4 = *puVar4 | 0x10, data != (Curl_easy *)0x0 &&
        (((data->set).field_0x8bd & 0x10) != 0)))) {
      pcVar11 = "Signaling end of chunked upload via terminating chunk.";
LAB_006885b8:
      Curl_infof(data,pcVar11);
    }
  }
  if (bVar14) {
    sVar9 = strlen(local_38);
    uVar13 = sVar9 + uVar13;
  }
LAB_006885dc:
  *nreadp = uVar13;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct Curl_easy *data, size_t bytes,
                             size_t *nreadp)
{
  size_t buffersize = bytes;
  size_t nread;
  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;
  int eof_index = 0;

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.");
    data->state.trailers_state = TRAILERS_SENDING;
    Curl_dyn_init(&data->state.trailers_buf, DYN_TRAILERS);

    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_dyn_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.");
    curl_slist_free_all(trailers);
  }
#endif

#ifndef CURL_DISABLE_HTTP
  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = trailers_read;
    extra_data = (void *)data;
    eof_index = 1;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  if(!data->req.fread_eof[eof_index]) {
    Curl_set_in_callback(data, true);
    nread = readfunc(data->req.upload_fromhere, 1, buffersize, extra_data);
    Curl_set_in_callback(data, false);
    /* make sure the callback is not called again after EOF */
    data->req.fread_eof[eof_index] = !nread;
  }
  else
    nread = 0;

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(data->conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

#ifndef CURL_DISABLE_HTTP
  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on state.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->state.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

    if(data->state.trailers_state == TRAILERS_SENDING &&
       !trailers_left(data)) {
      Curl_dyn_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.");
    }
    else
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#endif

  *nreadp = nread;

  return CURLE_OK;
}